

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> * __thiscall
Lib::
Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
::insert(Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
         *this,SymbolId *key,AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *val,
        uint code)

{
  uint uVar1;
  bool bVar2;
  AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *pAVar3;
  uint in_ECX;
  uint *in_RSI;
  Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
  *in_RDI;
  Entry *entry;
  SymbolId *in_stack_ffffffffffffff78;
  SymbolId *in_stack_ffffffffffffff80;
  Entry *this_00;
  Entry *local_30;
  
  local_30 = firstEntryForCode(in_RDI,in_ECX);
  do {
    bVar2 = Entry::occupied(local_30);
    if (!bVar2) {
      in_RDI->_noOfEntries = in_RDI->_noOfEntries + 1;
      uVar1 = *in_RSI;
      this_00 = local_30;
      Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::AnyNumber
                ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)local_30,
                 (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)
                 in_stack_ffffffffffffff78);
      Entry::init(this_00,(EVP_PKEY_CTX *)(ulong)uVar1);
      Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::~AnyNumber
                ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)0x73a634);
      pAVar3 = Entry::value(local_30);
      return pAVar3;
    }
    if (local_30->code == in_ECX) {
      Entry::key(local_30);
      bVar2 = StlHash::equals<Kernel::Variable>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
      ;
      if (bVar2) {
        pAVar3 = Entry::value(local_30);
        return pAVar3;
      }
    }
    local_30 = nextEntry(in_RDI,local_30);
  } while( true );
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }